

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O3

S2CellId __thiscall S2CellId::FromDebugString(S2CellId *this,string_view str)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  S2CellId id;
  S2CellId local_30;
  
  pcVar2 = str.ptr_;
  if ((int)str.ptr_ - 0x21U < 0xffffffe1) {
    return (S2CellId)0;
  }
  bVar1 = (byte)this->id_;
  if ((0xf9 < (byte)(bVar1 - 0x36)) && (*(char *)((long)&this->id_ + 1) == '/')) {
    local_30.id_ = (ulong)bVar1 << 0x3d | 0x1000000000000000;
    if (pcVar2 < (char *)0x3) {
      return (S2CellId)local_30.id_;
    }
    bVar1 = *(byte *)((long)&this->id_ + 2);
    if ((bVar1 & 0xfc) == 0x30) {
      pcVar3 = (char *)0x2;
      do {
        local_30 = child(&local_30,bVar1 - 0x30);
        if (pcVar3 + (3 - (long)pcVar2) == (char *)0x2) {
          return (S2CellId)local_30.id_;
        }
        bVar1 = ((undefined1 *)((long)&this->id_ + 1))[(long)pcVar3];
        pcVar3 = pcVar3 + 1;
      } while ((bVar1 & 0xfc) == 0x30);
      if (pcVar2 <= pcVar3) {
        return (S2CellId)local_30.id_;
      }
      return (S2CellId)0;
    }
  }
  return (S2CellId)0;
}

Assistant:

S2CellId S2CellId::FromDebugString(absl::string_view str) {
  // This function is reasonably efficient, but is only intended for use in
  // tests.
  int level = static_cast<int>(str.size() - 2);
  if (level < 0 || level > S2CellId::kMaxLevel) return S2CellId::None();
  int face = str[0] - '0';
  if (face < 0 || face > 5 || str[1] != '/') return S2CellId::None();
  S2CellId id = S2CellId::FromFace(face);
  for (int i = 2; i < str.size(); ++i) {
    int child_pos = str[i] - '0';
    if (child_pos < 0 || child_pos > 3) return S2CellId::None();
    id = id.child(child_pos);
  }
  return id;
}